

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionExecutionStateMachine.cpp
# Opt level: O2

uint16 __thiscall
Js::FunctionExecutionStateMachine::GetProfiledIterations(FunctionExecutionStateMachine *this)

{
  ushort uVar1;
  code *pcVar2;
  bool bVar3;
  ExecutionMode EVar4;
  ushort uVar5;
  uint16 uVar6;
  undefined4 *puVar7;
  ushort uVar8;
  
  if (this->initializedExecutionModeAndLimits == false) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                ,0x2d9,"(initializedExecutionModeAndLimits)",
                                "initializedExecutionModeAndLimits");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
  }
  uVar1 = this->committedProfiledIterations;
  EVar4 = GetExecutionMode(this);
  uVar8 = uVar1;
  if (EVar4 == SimpleJit) {
    if (DAT_01441e6c == '\0') {
      uVar6 = GetSimpleJitExecutedIterations(this);
      uVar8 = 0xffff;
      if (!CARRY2(uVar1,uVar6)) {
        uVar8 = uVar1 + uVar6;
      }
    }
  }
  else if (EVar4 == ProfilingInterpreter) {
    uVar5 = (ushort)this->interpretedCount;
    if (0xfffe < this->interpretedCount) {
      uVar5 = 0xffff;
    }
    uVar8 = uVar1 + uVar5;
    if (CARRY2(uVar1,uVar5)) {
      uVar8 = 0xffff;
    }
  }
  return uVar8;
}

Assistant:

uint16 FunctionExecutionStateMachine::GetProfiledIterations() const
    {
        Assert(initializedExecutionModeAndLimits);

        uint16 profiledIterations = committedProfiledIterations;
        switch (GetExecutionMode())
        {
        case ExecutionMode::ProfilingInterpreter:
        {
            uint32 interpretedCount = GetInterpretedCount();
            const uint16 clampedInterpretedCount =
                interpretedCount <= UINT16_MAX
                ? static_cast<uint16>(interpretedCount)
                : UINT16_MAX;
            const uint16 newProfiledIterations = profiledIterations + clampedInterpretedCount;
            profiledIterations = newProfiledIterations >= profiledIterations ? newProfiledIterations : UINT16_MAX;
            break;
        }

        case ExecutionMode::SimpleJit:
            if (!CONFIG_FLAG(NewSimpleJit))
            {
                const uint16 newProfiledIterations = profiledIterations + GetSimpleJitExecutedIterations();
                profiledIterations = newProfiledIterations >= profiledIterations ? newProfiledIterations : UINT16_MAX;
            }
            break;
        }
        return profiledIterations;
    }